

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_multicheck(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  MULTDATA CHARLIST [80];
  int j;
  int i;
  int count;
  DESCRIPTOR_DATA *d;
  char buf2 [4608];
  char buf [9216];
  undefined8 auStackY_38b8 [2];
  CHAR_DATA *in_stack_ffffffffffffc758;
  CHAR_DATA *in_stack_ffffffffffffc760;
  CHAR_DATA *in_stack_ffffffffffffc768;
  int local_3628;
  DESCRIPTOR_DATA *local_3620;
  
  local_3628 = 0;
  local_3620 = descriptor_list;
  while( true ) {
    if (local_3620 == (DESCRIPTOR_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffc760,in_stack_ffffffffffffc758);
      return;
    }
    if ((local_3620->character != (CHAR_DATA *)0x0) &&
       (bVar1 = can_see(in_stack_ffffffffffffc768,in_stack_ffffffffffffc760), bVar1)) {
      auStackY_38b8[local_3628] = local_3620;
      local_3628 = local_3628 + 1;
    }
    if (0x50 < local_3628) break;
    local_3620 = local_3620->next;
  }
  send_to_char((char *)in_stack_ffffffffffffc760,in_stack_ffffffffffffc758);
  return;
}

Assistant:

void do_multicheck(CHAR_DATA *ch, char *argument)
{
	char buf[2 * MAX_STRING_LENGTH];
	char buf2[MAX_STRING_LENGTH];
	DESCRIPTOR_DATA *d;
	int count = 0, i = 0, j = 0;
	MULTDATA CHARLIST[80];

	buf[0] = '\0';

	for (d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->character != nullptr && can_see(ch, d->character))
		{
			CHARLIST[i].des = d;
			i++;
		}

		if (i > 80)
		{
			send_to_char("Max 80 characters, have coder fix.\n\r", ch);
			return;
		}
	}

	return send_to_char("Fix later.\n\r", ch);
	// qsort(CHARLIST, i, sizeof(MULTDATA), (void*)&host_comp);

	if (i < 2)
	{
		send_to_char("This command is not usable with only 1 player.\n\r", ch);
		return;
	}

	for (j = 0; j < i - 1; j++)
	{
		/*
		if((!strcmp(get_end_host(CHARLIST[j].des->host), get_end_host(CHARLIST[j+1].des->host))) ||
			(j!=0&&!strcmp(get_end_host(CHARLIST[j].des->host),
			get_end_host(CHARLIST[j-1].des->host)))) {
		*/
		if (!strcmp(CHARLIST[j].des->host, CHARLIST[j + 1].des->host)
			|| (j != 0 && !strcmp(CHARLIST[j].des->host, CHARLIST[j - 1].des->host)))
		{
			count++;

			sprintf(buf + strlen(buf), "[%3d %2d] %s@%s\n\r",
				CHARLIST[j].des->descriptor,
				CHARLIST[j].des->connected,
				CHARLIST[j].des->original
					? CHARLIST[j].des->original->true_name
						? CHARLIST[j].des->original->true_name
						: CHARLIST[j].des->original->name
					: CHARLIST[j].des->character
						? CHARLIST[j].des->character->true_name
							? CHARLIST[j].des->character->true_name
							: CHARLIST[j].des->character->name
						: "(none)",
				(get_trust(ch) >= 55) ? CHARLIST[j].des->host : "unknown");
		}
	}

	/*
	if(!strcmp(get_end_host(CHARLIST[j].des->host),
		get_end_host(CHARLIST[j-1].des->host))) {
	*/
	if (!strcmp(CHARLIST[j].des->host, CHARLIST[j - 1].des->host))
	{
		count++;
		sprintf(buf + strlen(buf), "[%3d %2d] %s@%s\n\r",
			CHARLIST[j].des->descriptor,
			CHARLIST[j].des->connected,
			CHARLIST[j].des->original
				? CHARLIST[j].des->original->name
				: CHARLIST[j].des->character
					? CHARLIST[j].des->character->name : "(none)",
			(get_trust(ch) >= 55) ? CHARLIST[j].des->host : "unknown");
	}

	if (count == 0)
	{
		send_to_char("No matches were found.\n\r", ch);
		return;
	}

	sprintf(buf2, "%d user%s\n\r", count, count == 1 ? "" : "s");
	strcat(buf, buf2);
	page_to_char(buf, ch);
}